

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall FBlockThingsIterator::StartBlock(FBlockThingsIterator *this,int x,int y)

{
  int y_local;
  int x_local;
  FBlockThingsIterator *this_local;
  
  this->curx = x;
  this->cury = y;
  if ((((x < 0) || (y < 0)) || (bmapwidth <= x)) || (bmapheight <= y)) {
    this->block = (FBlockNode *)0x0;
  }
  else {
    this->block = blocklinks[y * bmapwidth + x];
  }
  return;
}

Assistant:

void FBlockThingsIterator::StartBlock(int x, int y) 
{ 
	curx = x; 
	cury = y; 
	if (x >= 0 && y >= 0 && x < bmapwidth && y <bmapheight)
	{
		block = blocklinks[y*bmapwidth + x];
	}
	else
	{
		// invalid block
		block = NULL;
	}
}